

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O3

void tcu::ImageIO::loadPKM(CompressedTexture *dst,Archive *archive,char *fileName)

{
  pointer puVar1;
  ushort uVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  InternalError *pIVar5;
  deUint16 val;
  deUint8 magic [6];
  undefined8 local_28;
  long *plVar4;
  
  local_28 = in_RAX;
  iVar3 = (*archive->_vptr_Archive[2])(archive,fileName);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0x10))(plVar4,(long)&local_28 + 2,6);
  if (local_28._6_2_ != 0x3031 || local_28._2_4_ != 0x204d4b50) {
    pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (pIVar5,"Signature doesn\'t match PKM signature",(char *)plVar4[1],
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
               ,0xee);
    __cxa_throw(pIVar5,&InternalError::typeinfo,Exception::~Exception);
  }
  (**(code **)(*plVar4 + 0x10))(plVar4,&local_28,2);
  if ((ushort)local_28 == 0) {
    (**(code **)(*plVar4 + 0x10))(plVar4,&local_28,2);
    (**(code **)(*plVar4 + 0x10))(plVar4,&local_28,2);
    (**(code **)(*plVar4 + 0x10))(plVar4,&local_28,2);
    uVar2 = (ushort)local_28;
    (**(code **)(*plVar4 + 0x10))(plVar4,&local_28,2);
    CompressedTexture::setStorage
              (dst,COMPRESSEDTEXFORMAT_ETC1_RGB8,(uint)(ushort)(uVar2 << 8 | uVar2 >> 8),
               (uint)(ushort)((ushort)local_28 << 8 | (ushort)local_28 >> 8),1);
    puVar1 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    (**(code **)(*plVar4 + 0x10))
              (plVar4,puVar1,
               *(int *)&(dst->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar1);
    (**(code **)(*plVar4 + 8))(plVar4);
    return;
  }
  pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (pIVar5,"Unsupported PKM type",(char *)plVar4[1],
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
             ,0xf2);
  __cxa_throw(pIVar5,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void loadPKM (CompressedTexture& dst, const tcu::Archive& archive, const char* fileName)
{
	de::UniquePtr<Resource> resource(archive.getResource(fileName));

	// Check magic and version.
	deUint8 refMagic[] = {'P', 'K', 'M', ' ', '1', '0'};
	deUint8 magic[6];
	resource->read(magic, DE_LENGTH_OF_ARRAY(magic));

	if (memcmp(refMagic, magic, sizeof(magic)) != 0)
		throw InternalError("Signature doesn't match PKM signature", resource->getName().c_str(), __FILE__, __LINE__);

	deUint16 type = readBigEndianShort(resource.get());
	if (type != ETC1_RGB_NO_MIPMAPS)
		throw InternalError("Unsupported PKM type", resource->getName().c_str(), __FILE__, __LINE__);

	deUint16	width			= readBigEndianShort(resource.get());
	deUint16	height			= readBigEndianShort(resource.get());
	deUint16	activeWidth		= readBigEndianShort(resource.get());
	deUint16	activeHeight	= readBigEndianShort(resource.get());

    DE_UNREF(width && height);

	dst.setStorage(COMPRESSEDTEXFORMAT_ETC1_RGB8, (int)activeWidth, (int)activeHeight);
	resource->read((deUint8*)dst.getData(), dst.getDataSize());
}